

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this,
          size_t pos)

{
  StringPtr *pSVar1;
  size_t sVar2;
  StringPtr *pSVar3;
  size_t back;
  size_t pos_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  pSVar1 = Vector<kj::StringPtr>::operator[](&this->rows,pos);
  Impl<0UL,_false>::erase(this,pos,pSVar1);
  sVar2 = Vector<kj::StringPtr>::size(&this->rows);
  sVar2 = sVar2 - 1;
  if (pos != sVar2) {
    pSVar1 = Vector<kj::StringPtr>::operator[](&this->rows,sVar2);
    Impl<0UL,_false>::move(this,sVar2,pos,pSVar1);
    pSVar1 = Vector<kj::StringPtr>::operator[](&this->rows,sVar2);
    pSVar1 = mv<kj::StringPtr>(pSVar1);
    pSVar3 = Vector<kj::StringPtr>::operator[](&this->rows,pos);
    (pSVar3->content).ptr = (pSVar1->content).ptr;
    (pSVar3->content).size_ = (pSVar1->content).size_;
  }
  Vector<kj::StringPtr>::removeLast(&this->rows);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}